

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O1

FFSIndexItem FFSread_index(FFSFile ffsfile)

{
  size_t __n;
  _FFSIndexItem *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *index_base;
  FFSIndexItem p_Var7;
  FFSIndexType paVar8;
  uchar *puVar9;
  uint *puVar10;
  long lVar11;
  
  iVar4 = (*ffs_file_lseek_func)(ffsfile->file_id,0,1);
  iVar5 = (*ffs_file_lseek_func)(ffsfile->file_id,0,2);
  (*ffs_file_lseek_func)(ffsfile->file_id,(long)iVar4,0);
  if (ffsfile->read_ahead == 0) {
    next_record_type(ffsfile);
  }
  while (ffsfile->next_record_type != FFSindex) {
    iVar4 = FFSconsume_next_item(ffsfile);
    if (iVar4 == 0) {
      return (FFSIndexItem)0x0;
    }
  }
  index_base = (char *)ffs_malloc(ffsfile->next_data_len);
  __n = ffsfile->next_data_len;
  iVar4 = (*ffs_file_lseek_func)(ffsfile->file_id,0,1);
  ffsfile->fpos = (long)iVar4;
  iVar6 = (*ffsfile->read_func)
                    (ffsfile->file_id,index_base + 4,ffsfile->next_data_len - 4,(int *)0x0,
                     (char **)0x0);
  if (ffsfile->next_data_len + -4 == (long)iVar6) {
    lVar11 = (long)iVar4 + -4;
    ffsfile->read_ahead = 0;
    p_Var7 = parse_index_block(index_base);
    ffsfile->read_index = p_Var7;
    if (p_Var7->next_index_offset == (long)iVar5) {
      paVar8 = (FFSIndexType)ffs_malloc(0x20);
      ffsfile->cur_index = paVar8;
      uVar2 = *(undefined4 *)&p_Var7->this_index_fpos;
      uVar3 = *(undefined4 *)((long)&p_Var7->this_index_fpos + 4);
      iVar4 = p_Var7->start_data_count;
      iVar5 = p_Var7->last_data_count;
      puVar9 = *(uchar **)&p_Var7->end_item_offset;
      (paVar8->write_info).base_file_pos = p_Var7->next_index_offset;
      *(undefined4 *)((long)paVar8 + 8) = uVar2;
      *(undefined4 *)((long)paVar8 + 0xc) = uVar3;
      *(int *)((long)paVar8 + 0x10) = iVar4;
      *(int *)((long)paVar8 + 0x14) = iVar5;
      (paVar8->write_info).index_block = puVar9;
      (ffsfile->cur_index->write_info).base_file_pos = lVar11;
      (ffsfile->cur_index->write_info).data_index_start = 0;
      (ffsfile->cur_index->write_info).index_block_size = 0x100;
      (ffsfile->cur_index->write_info).data_index_end = 0;
      (ffsfile->cur_index->write_info).next_item_offset = p_Var7->end_item_offset;
      puVar9 = (uchar *)ffs_malloc(0x100);
      (ffsfile->cur_index->write_info).index_block = puVar9;
      memset((ffsfile->cur_index->write_info).index_block,0,0x100);
      memcpy((ffsfile->cur_index->write_info).index_block,index_base,__n);
      ffsfile->data_count = p_Var7->last_data_count + 1;
    }
    free(index_base);
    p_Var7->this_index_fpos = lVar11;
    if (ffsfile->index_head == (FFSIndexItem)0x0) {
      ffsfile->index_head = p_Var7;
      ffsfile->index_tail = p_Var7;
      p_Var7->next = (_FFSIndexItem *)0x0;
      p_Var7->prev = (_FFSIndexItem *)0x0;
      return p_Var7;
    }
    p_Var1 = ffsfile->index_tail;
    p_Var1->next = p_Var7;
    p_Var7->prev = p_Var1;
    p_Var7->next = (_FFSIndexItem *)0x0;
    ffsfile->index_tail = p_Var7;
    return p_Var7;
  }
  puVar10 = (uint *)__errno_location();
  printf("Read failed, errno %d\n",(ulong)*puVar10);
  return (FFSIndexItem)0x0;
}

Assistant:

extern FFSIndexItem
FFSread_index(FFSFile ffsfile)
{
    char *index_data;
    FFSIndexItem index_item;
    off_t index_fpos;
    size_t index_size;
    int currentPos = ffs_file_lseek_func(ffsfile->file_id, (size_t)0, SEEK_CUR);
    int end = ffs_file_lseek_func(ffsfile->file_id, (size_t)0, SEEK_END);
    ffs_file_lseek_func(ffsfile->file_id, currentPos, SEEK_SET);   // seek back to original spot

    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSindex) {
	if (!FFSconsume_next_item(ffsfile)) return NULL;
    }
    index_data = malloc(ffsfile->next_data_len);
    index_size = ffsfile->next_data_len;
    update_fpos(ffsfile);
    index_fpos = ffsfile->fpos - 4;
    if (ffsfile->read_func(ffsfile->file_id, index_data+4, 
			   ffsfile->next_data_len-4, NULL, NULL)
	!= ffsfile->next_data_len-4) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    ffsfile->read_ahead = FALSE;
    index_item = parse_index_block(index_data);
    ffsfile->read_index = index_item;
    if (index_item->next_index_offset == end) {
	ffsfile->cur_index = malloc(sizeof(*(ffsfile->cur_index)));
	memcpy(ffsfile->cur_index, index_item, sizeof(*(ffsfile->cur_index)));
	ffsfile->cur_index->write_info.base_file_pos = index_fpos;
	ffsfile->cur_index->write_info.data_index_start = 0;
	ffsfile->cur_index->write_info.index_block_size = INDEX_BLOCK_SIZE;
	ffsfile->cur_index->write_info.data_index_end = 0;
	ffsfile->cur_index->write_info.next_item_offset = index_item->end_item_offset;
	ffsfile->cur_index->write_info.index_block = malloc(INDEX_BLOCK_SIZE);
	memset(	ffsfile->cur_index->write_info.index_block, 0, INDEX_BLOCK_SIZE);
	memcpy(ffsfile->cur_index->write_info.index_block, index_data, index_size);
	ffsfile->data_count = index_item->last_data_count+1;
    }
    free(index_data);
    index_item->this_index_fpos = index_fpos;
    if (ffsfile->index_head == NULL) {
	ffsfile->index_head = index_item;
	ffsfile->index_tail = index_item;
	index_item->prev = NULL;
	index_item->next = NULL;
    } else {
	ffsfile->index_tail->next = index_item;
	index_item->prev = ffsfile->index_tail;
	index_item->next = NULL;
	ffsfile->index_tail = index_item;
    }
    return index_item;
}